

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plot-brdf.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *__stream;
  int iVar1;
  int iVar2;
  size_type sVar3;
  GLFWwindow *handle;
  EVP_PKEY_CTX *ctx;
  bool bVar4;
  double dVar5;
  exception *e;
  GLFWwindow *window;
  int i;
  GLenum startVisible;
  char **argv_local;
  int argc_local;
  
  window._4_4_ = 1;
  for (window._0_4_ = 1; (int)window < argc; window._0_4_ = (int)window + 1) {
    iVar1 = strcmp("--merl",argv[(int)window]);
    if (iVar1 == 0) {
      std::vector<const_char_*,_std::allocator<const_char_*>_>::resize
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)&g_sphere.shading,0);
      do {
        iVar1 = (int)window + 1;
        std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                  ((vector<const_char_*,_std::allocator<const_char_*>_> *)&g_sphere.shading,
                   argv + iVar1);
        bVar4 = false;
        if ((int)window + 2 < argc) {
          iVar2 = strncmp("-",argv[(int)window + 2],1);
          bVar4 = iVar2 != 0;
        }
        __stream = _stdout;
        window._0_4_ = iVar1;
      } while (bVar4);
      sVar3 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                        ((vector<const_char_*,_std::allocator<const_char_*>_> *)&g_sphere.shading);
      fprintf(__stream,"Note: number of MERL BRDFs set to %i\n",sVar3 & 0xffffffff);
      fflush(_stdout);
    }
    else {
      iVar1 = strcmp("--output-dir",argv[(int)window]);
      if (iVar1 == 0) {
        window._0_4_ = (int)window + 1;
        g_app.dir.output = argv[(int)window];
        fprintf(_stdout,"Note: output directory set to %s\n",g_app.dir.output);
        fflush(_stdout);
      }
      else {
        iVar1 = strcmp("--shader-dir",argv[(int)window]);
        if (iVar1 == 0) {
          window._0_4_ = (int)window + 1;
          g_app.dir.shader = argv[(int)window];
          fprintf(_stdout,"Note: shader directory set to %s\n",g_app.dir.shader);
          fflush(_stdout);
        }
        else {
          iVar1 = strcmp("--record",argv[(int)window]);
          if (iVar1 == 0) {
            g_app.recorder.on = 1;
            fprintf(_stdout,"Note: recording enabled\n");
            fflush(_stdout);
          }
          else {
            iVar1 = strcmp("--no-hud",argv[(int)window]);
            if (iVar1 == 0) {
              g_app.viewer.hud = false;
              fprintf(_stdout,"Note: HUD rendering disabled\n");
              fflush(_stdout);
            }
            else {
              iVar1 = strcmp("--hidden",argv[(int)window]);
              if (iVar1 == 0) {
                window._4_4_ = 0;
                fprintf(_stdout,"Note: viewer will run hidden\n");
                fflush(_stdout);
              }
              else {
                iVar1 = strcmp("--frame-limit",argv[(int)window]);
                if (iVar1 == 0) {
                  window._0_4_ = (int)window + 1;
                  g_app.frameLimit = atoi(argv[(int)window]);
                  fprintf(_stdout,"Note: frame limit set to %i\n",(ulong)(uint)g_app.frameLimit);
                  fflush(_stdout);
                }
                else {
                  iVar1 = strcmp("--cmap",argv[(int)window]);
                  if (iVar1 == 0) {
                    window._0_4_ = (int)window + 1;
                    g_sphere.shading.pathToCmap = argv[(int)window];
                    fprintf(_stdout,"Note: cmap set to: %s\n",g_sphere.shading.pathToCmap);
                    fflush(_stdout);
                  }
                  else {
                    iVar1 = strcmp("--dir",argv[(int)window]);
                    if (iVar1 == 0) {
                      dVar5 = atof(argv[(int)window + 1]);
                      g_sphere.brdf.thetaI = (float)dVar5;
                      window._0_4_ = (int)window + 2;
                      dVar5 = atof(argv[(int)window]);
                      g_sphere.brdf.phiI = (float)dVar5;
                      fprintf(_stdout,"Note: wi set to: (%f %f)\n",(double)g_sphere.brdf.thetaI,
                              (double)g_sphere.brdf.phiI);
                      fflush(_stdout);
                    }
                    else {
                      iVar1 = strcmp("--alpha",argv[(int)window]);
                      if (iVar1 == 0) {
                        window._0_4_ = (int)window + 1;
                        dVar5 = atof(argv[(int)window]);
                        g_sphere.brdf.ggxAlpha = (float)dVar5;
                        fprintf(_stdout,"Note: GGX alpha set to: %f\n",
                                (double)g_sphere.brdf.ggxAlpha);
                        fflush(_stdout);
                      }
                      else {
                        iVar1 = strcmp("--sc",argv[(int)window]);
                        if (iVar1 == 0) {
                          window._0_4_ = (int)window + 1;
                          dVar5 = atof(argv[(int)window]);
                          g_sphere.brdf.ggxAlpha = (float)dVar5;
                          fprintf(_stdout,"Note: GGX alpha set to: %f\n",
                                  (double)g_sphere.brdf.ggxAlpha);
                          fflush(_stdout);
                        }
                        else {
                          iVar1 = strcmp("--color",argv[(int)window]);
                          if (iVar1 == 0) {
                            dVar5 = atof(argv[(int)window + 1]);
                            g_sphere.sphere.color.r = (float)dVar5;
                            dVar5 = atof(argv[(int)window + 2]);
                            g_sphere.sphere.color.g = (float)dVar5;
                            dVar5 = atof(argv[(int)window + 3]);
                            g_sphere.sphere.color.b = (float)dVar5;
                            window._0_4_ = (int)window + 4;
                            dVar5 = atof(argv[(int)window]);
                            g_sphere.sphere.color.a = (float)dVar5;
                            fprintf(_stdout,"Note: surface color set to: (%f %f %f %f)\n",
                                    (double)g_sphere.sphere.color.r,(double)g_sphere.sphere.color.g,
                                    (double)g_sphere.sphere.color.b,(double)g_sphere.sphere.color.a)
                            ;
                            fflush(_stdout);
                          }
                          else {
                            iVar1 = strcmp("--enable-sphere-lines",argv[(int)window]);
                            if (iVar1 == 0) {
                              g_sphere.flags.showLines = true;
                              fprintf(_stdout,"Note: rendering flag sphere-lines set to true\n");
                              fflush(_stdout);
                            }
                            else {
                              iVar1 = strcmp("--disable-sphere-lines",argv[(int)window]);
                              if (iVar1 == 0) {
                                g_sphere.flags.showLines = false;
                                fprintf(_stdout,"Note: rendering flag sphere-lines set to false\n");
                                fflush(_stdout);
                              }
                              else {
                                iVar1 = strcmp("--enable-sphere-surface",argv[(int)window]);
                                if (iVar1 == 0) {
                                  g_sphere.flags.showSurface = true;
                                  fprintf(_stdout,
                                          "Note: rendering flag sphere-surface set to true\n");
                                  fflush(_stdout);
                                }
                                else {
                                  iVar1 = strcmp("--disable-sphere-surface",argv[(int)window]);
                                  if (iVar1 == 0) {
                                    g_sphere.flags.showSurface = false;
                                    fprintf(_stdout,
                                            "Note: rendering flag sphere-surface set to false\n");
                                    fflush(_stdout);
                                  }
                                  else {
                                    iVar1 = strcmp("--enable-sphere-samples",argv[(int)window]);
                                    if (iVar1 == 0) {
                                      g_sphere.flags.showSamples = true;
                                      fprintf(_stdout,
                                              "Note: rendering flag sphere-samples set to true\n");
                                      fflush(_stdout);
                                    }
                                    else {
                                      iVar1 = strcmp("--disable-sphere-samples",argv[(int)window]);
                                      if (iVar1 == 0) {
                                        g_sphere.flags.showSamples = false;
                                        fprintf(_stdout,
                                                "Note: rendering flag sphere-samples set to false\n"
                                               );
                                        fflush(_stdout);
                                      }
                                      else {
                                        iVar1 = strcmp("--enable-sphere-wi-helper",argv[(int)window]
                                                      );
                                        if (iVar1 == 0) {
                                          g_sphere.flags.showWiHelper = true;
                                          fprintf(_stdout,
                                                  "Note: rendering flag sphere-wi-helper set to true\n"
                                                 );
                                          fflush(_stdout);
                                        }
                                        else {
                                          iVar1 = strcmp("--disable-sphere-wi-helper",
                                                         argv[(int)window]);
                                          if (iVar1 == 0) {
                                            g_sphere.flags.showWiHelper = false;
                                            fprintf(_stdout,
                                                  "Note: rendering flag sphere-wi-helper set to false\n"
                                                  );
                                            fflush(_stdout);
                                          }
                                          else {
                                            iVar1 = strcmp("--enable-parametric",argv[(int)window]);
                                            if (iVar1 == 0) {
                                              g_sphere.flags.showParametric = true;
                                              fprintf(_stdout,
                                                  "Note: rendering flag parametric set to true\n");
                                              fflush(_stdout);
                                            }
                                            else {
                                              iVar1 = strcmp("--disable-parametric",
                                                             argv[(int)window]);
                                              if (iVar1 == 0) {
                                                g_sphere.flags.showParametric = false;
                                                fprintf(_stdout,
                                                  "Note: rendering flag parametric set to false\n");
                                                fflush(_stdout);
                                              }
                                              else {
                                                iVar1 = strcmp("--shading-color",argv[(int)window]);
                                                if (iVar1 == 0) {
                                                  g_sphere.shading.mode = 0;
                                                  fprintf(_stdout,
                                                  "Note: shading mode set to color\n");
                                                  fflush(_stdout);
                                                }
                                                else {
                                                  iVar1 = strcmp("--shading-cmap",argv[(int)window])
                                                  ;
                                                  if (iVar1 == 0) {
                                                    g_sphere.shading.mode = 1;
                                                    fprintf(_stdout,
                                                  "Note: shading mode set to cmap\n");
                                                  fflush(_stdout);
                                                  }
                                                  else {
                                                    iVar1 = strcmp("--shading-brdf",
                                                                   argv[(int)window]);
                                                    if (iVar1 == 0) {
                                                      g_sphere.shading.mode = 2;
                                                      fprintf(_stdout,
                                                  "Note: shading mode set to brdf\n");
                                                  fflush(_stdout);
                                                  }
                                                  else {
                                                    iVar1 = strcmp("--scheme-ggx",argv[(int)window])
                                                    ;
                                                    if (iVar1 == 0) {
                                                      g_sphere.samples.scheme = 1;
                                                      fprintf(_stdout,"Note: scheme set to ggx\n");
                                                      fflush(_stdout);
                                                    }
                                                    else {
                                                      iVar1 = strcmp("--scheme-merl",
                                                                     argv[(int)window]);
                                                      if (iVar1 == 0) {
                                                        g_sphere.samples.scheme = 0;
                                                        fprintf(_stdout,"Note: scheme set to merl\n"
                                                               );
                                                        fflush(_stdout);
                                                      }
                                                    }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  glfwInit();
  glfwWindowHint(0x22002,4);
  glfwWindowHint(0x22003,5);
  glfwWindowHint(0x22008,0x32001);
  glfwWindowHint(0x22007,1);
  glfwWindowHint(0x20004,window._4_4_);
  fprintf(_stdout,"Loading {Window-Main}\n");
  fflush(_stdout);
  handle = glfwCreateWindow(0x400,0x400,"Hello MERL",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
  if (handle == (GLFWwindow *)0x0) {
    fprintf(_stdout,"=> Failure <=\n");
    fflush(_stdout);
    glfwTerminate();
    argv_local._4_4_ = -1;
  }
  else {
    glfwMakeContextCurrent(handle);
    glfwSetKeyCallback(handle,keyboardCallback);
    glfwSetCursorPosCallback(handle,mouseMotionCallback);
    glfwSetMouseButtonCallback(handle,mouseButtonCallback);
    glfwSetScrollCallback(handle,mouseScrollCallback);
    fprintf(_stdout,"Loading {OpenGL}\n");
    fflush(_stdout);
    iVar1 = gladLoadGLLoader(glfwGetProcAddress);
    if (iVar1 == 0) {
      fprintf(_stdout,"gladLoadGLLoader failed\n");
      fflush(_stdout);
      argv_local._4_4_ = -1;
    }
    else {
      log_debug_output();
      fprintf(_stdout,"-- Begin -- Demo\n");
      fflush(_stdout);
      ImGui::CreateContext((ImFontAtlas *)0x0);
      ImGui_ImplGlfwGL3_Init(handle,false,(char *)0x0);
      ctx = (EVP_PKEY_CTX *)0x0;
      ImGui::StyleColorsDark((ImGuiStyle *)0x0);
      init(ctx);
      while (iVar1 = glfwWindowShouldClose(handle),
            iVar1 == 0 && (uint)g_app.frame < (uint)g_app.frameLimit) {
        glfwPollEvents();
        render();
        g_app.frame = g_app.frame + 1;
        glfwSwapBuffers(handle);
      }
      release();
      ImGui_ImplGlfwGL3_Shutdown();
      ImGui::DestroyContext((ImGuiContext *)0x0);
      glfwTerminate();
      fprintf(_stdout,"-- End -- Demo\n");
      fflush(_stdout);
      argv_local._4_4_ = 0;
    }
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, const char **argv)
{
    GLenum startVisible = GL_TRUE;

    #define PARSE_SHADING_MODE(str, enumval)               \
    else if (!strcmp("--shading-" str, argv[i])) {      \
            g_sphere.shading.mode = enumval;              \
            LOG("Note: shading mode set to " str "\n");  \
    }
    #define PARSE_SAMPLING_SCHEME(str, enumval)               \
    else if (!strcmp("--scheme-" str, argv[i])) {      \
            g_sphere.samples.scheme = enumval;              \
            LOG("Note: scheme set to " str "\n");  \
    }
    #define PARSE_SPHERE_FLAG(str, flag)                    \
    else if (!strcmp("--enable-" str, argv[i])) {           \
        flag = true;                                        \
        LOG("Note: rendering flag " str " set to true\n");   \
    } else if  (!strcmp("--disable-" str, argv[i])) {       \
        flag = false;                                       \
        LOG("Note: rendering flag " str " set to false\n");  \
    }

    for (int i = 1; i < argc; ++i) {
        if (!strcmp("--merl", argv[i])) {
            g_sphere.shading.merl.files.resize(0);
            do {
                g_sphere.shading.merl.files.push_back(argv[++i]);
            } while ((i+1 < argc) && strncmp("-", argv[i+1], 1));
            LOG("Note: number of MERL BRDFs set to %i\n", (int)g_sphere.shading.merl.files.size());
        } else if (!strcmp("--output-dir", argv[i])) {
            g_app.dir.output = (const char *)argv[++i];
            LOG("Note: output directory set to %s\n", g_app.dir.output);
        } else if (!strcmp("--shader-dir", argv[i])) {
            g_app.dir.shader = (const char *)argv[++i];
            LOG("Note: shader directory set to %s\n", g_app.dir.shader);
        } else if (!strcmp("--record", argv[i])) {
            g_app.recorder.on = true;
            LOG("Note: recording enabled\n");
        } else if (!strcmp("--no-hud", argv[i])) {
            g_app.viewer.hud = false;
            LOG("Note: HUD rendering disabled\n");
        } else if (!strcmp("--hidden", argv[i])) {
            startVisible = GL_FALSE;
            LOG("Note: viewer will run hidden\n");
        } else if (!strcmp("--frame-limit", argv[i])) {
            g_app.frameLimit = atoi(argv[++i]);
            LOG("Note: frame limit set to %i\n", g_app.frameLimit);
        } else if (!strcmp("--cmap", argv[i])) {
            g_sphere.shading.pathToCmap = argv[++i];
            LOG("Note: cmap set to: %s\n", g_sphere.shading.pathToCmap);
        } else if (!strcmp("--dir", argv[i])) {
            g_sphere.brdf.thetaI = atof(argv[++i]);
            g_sphere.brdf.phiI = atof(argv[++i]);
            LOG("Note: wi set to: (%f %f)\n", g_sphere.brdf.thetaI, g_sphere.brdf.phiI);
        } else if (!strcmp("--alpha", argv[i])) {
            g_sphere.brdf.ggxAlpha = atof(argv[++i]);
            LOG("Note: GGX alpha set to: %f\n", g_sphere.brdf.ggxAlpha);
        }  else if (!strcmp("--sc", argv[i])) {
            g_sphere.brdf.ggxAlpha = atof(argv[++i]);
            LOG("Note: GGX alpha set to: %f\n", g_sphere.brdf.ggxAlpha);
        } else if (!strcmp("--color", argv[i])) {
            g_sphere.sphere.color.r = atof(argv[++i]);
            g_sphere.sphere.color.g = atof(argv[++i]);
            g_sphere.sphere.color.b = atof(argv[++i]);
            g_sphere.sphere.color.a = atof(argv[++i]);
            LOG("Note: surface color set to: (%f %f %f %f)\n",
                g_sphere.sphere.color.r,
                g_sphere.sphere.color.g,
                g_sphere.sphere.color.b,
                g_sphere.sphere.color.a);
        }
        PARSE_SPHERE_FLAG("sphere-lines", g_sphere.flags.showLines)
        PARSE_SPHERE_FLAG("sphere-surface", g_sphere.flags.showSurface)
        PARSE_SPHERE_FLAG("sphere-samples", g_sphere.flags.showSamples)
        PARSE_SPHERE_FLAG("sphere-wi-helper", g_sphere.flags.showWiHelper)
        PARSE_SPHERE_FLAG("parametric", g_sphere.flags.showParametric)
        PARSE_SHADING_MODE("color", SHADING_COLOR)
        PARSE_SHADING_MODE("cmap" , SHADING_COLORMAP)
        PARSE_SHADING_MODE("brdf" , SHADING_BRDF)
        PARSE_SAMPLING_SCHEME("ggx", SCHEME_GGX)
        PARSE_SAMPLING_SCHEME("merl", SCHEME_MERL)
    }

    glfwInit();
    glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 4);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 5);
    glfwWindowHint(GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE);
    glfwWindowHint(GLFW_OPENGL_DEBUG_CONTEXT, GL_TRUE);
    glfwWindowHint(GLFW_VISIBLE, startVisible);

    // Create the Window
    LOG("Loading {Window-Main}\n");
    GLFWwindow* window = glfwCreateWindow(
                             VIEWER_DEFAULT_WIDTH,
                             VIEWER_DEFAULT_HEIGHT,
                             "Hello MERL", NULL, NULL
                             );
    if (window == NULL) {
        LOG("=> Failure <=\n");
        glfwTerminate();
        return -1;
    }
    glfwMakeContextCurrent(window);
    glfwSetKeyCallback(window, &keyboardCallback);
    glfwSetCursorPosCallback(window, &mouseMotionCallback);
    glfwSetMouseButtonCallback(window, &mouseButtonCallback);
    glfwSetScrollCallback(window, &mouseScrollCallback);

    // Load OpenGL functions
    LOG("Loading {OpenGL}\n");
    if (!gladLoadGLLoader((GLADloadproc)glfwGetProcAddress)) {
        LOG("gladLoadGLLoader failed\n");
        return -1;
    }
    log_debug_output();

    LOG("-- Begin -- Demo\n");
    try {
        //log_debug_output();
        ImGui::CreateContext();
        ImGui_ImplGlfwGL3_Init(window, false);
        ImGui::StyleColorsDark();
        init();

        while (!glfwWindowShouldClose(window) && (uint32_t)g_app.frame < (uint32_t)g_app.frameLimit) {
            glfwPollEvents();

            render();
            ++g_app.frame;

            glfwSwapBuffers(window);
        }

        release();
        ImGui_ImplGlfwGL3_Shutdown();
        ImGui::DestroyContext();
        glfwTerminate();
    } catch (std::exception& e) {
        LOG("%s", e.what());
        ImGui_ImplGlfwGL3_Shutdown();
        ImGui::DestroyContext();
        glfwTerminate();
        LOG("(!) Demo Killed (!)\n");

        return EXIT_FAILURE;
    } catch (...) {
        ImGui_ImplGlfwGL3_Shutdown();
        ImGui::DestroyContext();
        glfwTerminate();
        LOG("(!) Demo Killed (!)\n");

        return EXIT_FAILURE;
    }
    LOG("-- End -- Demo\n");


    return 0;
}